

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_float(MIR_context_t ctx,writer_func_t writer,float fl)

{
  size_t *psVar1;
  uint uVar2;
  reduce_data *data;
  uint32_t uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  
  if (writer != (writer_func_t)0x0) {
    data = ctx->io_ctx->io_reduce_data;
    uVar2 = data->buf_bound;
    if ((ulong)uVar2 < 0x40000) {
      uVar3 = uVar2 + 1;
      puVar5 = data->buf + uVar2;
    }
    else {
      _reduce_encode_buf(data);
      puVar5 = data->buf;
      uVar3 = 1;
      in_register_00000014 = extraout_var;
    }
    *puVar5 = '\x11';
    data->buf_bound = uVar3;
    sVar4 = put_uint(ctx,writer,CONCAT44(in_register_00000014,fl),4);
    psVar1 = &ctx->io_ctx->output_float_len;
    *psVar1 = *psVar1 + sVar4 + 1;
    return sVar4 + 1;
  }
  return 0;
}

Assistant:

static size_t write_float (MIR_context_t ctx, writer_func_t writer, float fl) {
  size_t len;

  if (writer == NULL) return 0;
  put_byte (ctx, writer, TAG_F);
  len = put_float (ctx, writer, fl) + 1;
  output_float_len += len;
  return len;
}